

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.hpp
# Opt level: O2

void __thiscall imgtogb::StdOutput::StdOutput(StdOutput *this,string *basename,string *author)

{
  (this->super_CmdLineOutput)._vptr_CmdLineOutput = (_func_int **)&PTR__StdOutput_0014d808;
  std::__cxx11::string::string((string *)&this->basename,(string *)basename);
  std::__cxx11::string::string((string *)&this->author,(string *)author);
  return;
}

Assistant:

StdOutput(const std::string &basename, const std::string &author)
			: basename(basename)
			, author(author)
			{ }